

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integer.hpp
# Opt level: O2

void njoy::tools::disco::Integer<70u>::write<int,std::back_insert_iterator<std::__cxx11::string>>
               (int *value,
               back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *iter)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  string local_1c0 [8];
  long local_1b8;
  ostringstream buffer;
  undefined8 uStack_190;
  uint auStack_188 [88];
  
  iVar1 = *value;
  iVar2 = -iVar1;
  if (0 < iVar1) {
    iVar2 = iVar1;
  }
  iVar2 = Integer<70U>::minimumRequiredWidth<int>(iVar2);
  iVar1 = *value;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&buffer);
  *(uint *)((long)auStack_188 + *(long *)(_buffer + -0x18)) =
       *(uint *)((long)auStack_188 + *(long *)(_buffer + -0x18)) & 0xffffff4f | 0x80;
  *(undefined8 *)((long)&uStack_190 + *(long *)(_buffer + -0x18)) = 0x46;
  if ((uint)(iVar2 - (iVar1 >> 0x1f)) < 0x47) {
    std::ostream::operator<<(&buffer,*value);
  }
  else {
    poVar3 = std::operator<<(&buffer,0x2a);
    std::operator<<(poVar3,'*');
  }
  std::__cxx11::stringbuf::str();
  for (lVar4 = 0; local_1b8 != lVar4; lVar4 = lVar4 + 1) {
    std::__cxx11::string::push_back((char)iter->container);
  }
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buffer);
  return;
}

Assistant:

static void write( const Representation& value, Iterator& iter ) {

    // std::abs does not exist for all integer types (e.g. unsigned)
    const Representation absValue = value < 0 ? -value : value;
    const auto required = minimumRequiredWidth( absValue )
                        + ( value < 0 ? 1 : 0 );

    std::ostringstream buffer;
    buffer << std::right << std::setw( Width );
    if ( required > Width ) {

      buffer << std::setfill( '*' ) << '*';
    }
    else {

      buffer << value;
    }

    for ( auto b : buffer.str() ) {

      *iter++ = b;
    }
  }